

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> __thiscall
wabt::intrusive_list<wabt::ModuleField>::extract_front(intrusive_list<wabt::ModuleField> *this)

{
  long lVar1;
  ModuleField *pMVar2;
  ModuleField *pMVar3;
  long *in_RSI;
  ModuleField **ppMVar4;
  
  lVar1 = in_RSI[2];
  if (lVar1 != 0) {
    pMVar2 = (ModuleField *)*in_RSI;
    if (pMVar2 == (ModuleField *)in_RSI[1]) {
      ppMVar4 = (ModuleField **)(in_RSI + 1);
      pMVar3 = (ModuleField *)0x0;
    }
    else {
      pMVar3 = (pMVar2->super_intrusive_list_base<wabt::ModuleField>).next_;
      ppMVar4 = &(pMVar3->super_intrusive_list_base<wabt::ModuleField>).prev_;
    }
    *ppMVar4 = (ModuleField *)0x0;
    *in_RSI = (long)pMVar3;
    (pMVar2->super_intrusive_list_base<wabt::ModuleField>).next_ = (ModuleField *)0x0;
    (pMVar2->super_intrusive_list_base<wabt::ModuleField>).prev_ = (ModuleField *)0x0;
    in_RSI[2] = lVar1 + -1;
    this->first_ = pMVar2;
    return (__uniq_ptr_data<wabt::ModuleField,_std::default_delete<wabt::ModuleField>,_true,_true>)
           (__uniq_ptr_data<wabt::ModuleField,_std::default_delete<wabt::ModuleField>,_true,_true>)
           this;
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                ,0x1db,
                "std::unique_ptr<T> wabt::intrusive_list<wabt::ModuleField>::extract_front() [T = wabt::ModuleField]"
               );
}

Assistant:

inline bool intrusive_list<T>::empty() const noexcept {
  return size_ == 0;
}